

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O1

re_status_t re_compile(re_context *ctx,char *expr,size_t exprlen,re_machine *result_machine)

{
  re_tuple *prVar1;
  uchar *puVar2;
  byte bVar3;
  int iVar4;
  re_state_id rVar5;
  re_state_id rVar6;
  uchar *puVar7;
  undefined1 uVar8;
  byte bVar9;
  char cVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  re_machine new_machine;
  re_machine cur_machine;
  re_machine alter_machine;
  uchar set [32];
  anon_struct_20_3_53c8f05c group_stack [50];
  re_machine local_468;
  re_machine local_460;
  re_machine local_458;
  ulong local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  re_machine *local_420;
  re_machine arStack_418 [2];
  int aiStack_408 [246];
  
  local_420 = result_machine;
  re_reset(ctx);
  local_460.init = -1;
  local_460.final = -1;
  local_458.init = -1;
  local_458.final = -1;
  if (exprlen != 0) {
    uVar16 = 0;
    do {
      bVar9 = *expr;
      uVar17 = exprlen;
      if (0x5a < bVar9) {
        if (bVar9 != 0x5b) {
          if (bVar9 != 0x7c) {
            if ((bVar9 == 0x5e) && (local_460.init == -1)) {
              cVar10 = '\x03';
              goto LAB_0021ea99;
            }
            goto switchD_0021e71a_caseD_26;
          }
          re_alternate_onto(ctx,&local_458,&local_460);
          local_460.init = -1;
          local_460.final = -1;
          goto LAB_0021ed45;
        }
        local_438 = 0;
        uStack_430 = 0;
        local_448 = 0;
        uStack_440 = 0;
        pbVar15 = (byte *)expr + 1;
        uVar8 = 0xb;
        uVar11 = exprlen - 1;
        if (uVar11 == 0) {
          uVar11 = 0;
        }
        else if (*pbVar15 == 0x5e) {
          pbVar15 = (byte *)expr + 2;
          uVar11 = exprlen - 2;
          uVar8 = 0xc;
        }
        if (uVar11 == 0) {
          uVar11 = 0;
        }
        else if (*pbVar15 == 0x5d) {
          uStack_440 = 0x20000000;
          pbVar15 = pbVar15 + 1;
          uVar11 = uVar11 - 1;
        }
        if (uVar11 == 0) {
          uVar11 = 0;
        }
        else if (*pbVar15 == 0x2d) {
          local_448 = 0x200000000000;
          pbVar15 = pbVar15 + 1;
          uVar11 = uVar11 - 1;
        }
        local_450 = CONCAT71(local_450._1_7_,uVar8);
        while ((uVar17 = uVar11, expr = (char *)pbVar15, uVar17 != 0 &&
               (bVar9 = *expr, bVar9 != 0x5d))) {
          pbVar15 = (byte *)((long)&local_448 + (ulong)(bVar9 >> 3));
          *pbVar15 = *pbVar15 | '\x01' << (bVar9 & 7);
          pbVar15 = (byte *)expr + 1;
          if (uVar17 - 1 == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = uVar17 - 1;
            if (*pbVar15 == 0x2d) {
              if (uVar17 == 2) {
                pbVar15 = (byte *)expr + 2;
                uVar11 = 0;
              }
              else {
                bVar3 = ((byte *)expr)[2];
                uVar14 = (uint)bVar3;
                if (bVar9 < bVar3) {
                  uVar14 = (uint)bVar9;
                }
                uVar13 = (uint)bVar3;
                if (bVar3 < bVar9) {
                  uVar13 = (uint)bVar9;
                }
                do {
                  pbVar15 = (byte *)((long)&local_448 + (ulong)(uVar14 >> 3));
                  *pbVar15 = *pbVar15 | (byte)(1 << ((byte)uVar14 & 7));
                  uVar14 = uVar14 + 1;
                } while (uVar13 + 1 != uVar14);
                pbVar15 = (byte *)expr + 3;
                uVar11 = uVar17 - 3;
              }
            }
          }
        }
        rVar5 = re_alloc_state(ctx);
        local_468.init = rVar5;
        rVar6 = re_alloc_state(ctx);
        local_468.final = rVar6;
        prVar1 = ctx->tuple_arr + rVar5;
        if (ctx->tuple_arr[rVar5].next_state_1 == -1) {
          if ((prVar1->flags & 6) == 0) {
            prVar1->ch = (char)local_450;
          }
          prVar1->next_state_1 = rVar6;
        }
        else {
          prVar1->next_state_2 = rVar6;
        }
        puVar7 = mchalo(ctx->errctx,0x20,"regex range");
        *(undefined8 *)puVar7 = local_448;
        *(undefined8 *)(puVar7 + 8) = uStack_440;
        *(undefined8 *)(puVar7 + 0x10) = local_438;
        *(undefined8 *)(puVar7 + 0x18) = uStack_430;
        ctx->tuple_arr[rVar5].char_range = puVar7;
        goto LAB_0021ebea;
      }
      switch(bVar9) {
      case 0x24:
        if (((exprlen != 1) && (((byte *)expr)[1] != 0x7c)) && (((byte *)expr)[1] != 0x29))
        goto switchD_0021e71a_caseD_26;
        cVar10 = '\x04';
LAB_0021ea99:
        re_build_char(ctx,&local_468,cVar10);
        re_concat_onto(ctx,&local_460,&local_468);
        break;
      case 0x25:
        uVar17 = exprlen - 1;
        if (uVar17 != 0) {
          expr = (char *)((byte *)expr + 1);
          bVar9 = *expr;
          if (0x56 < bVar9) {
            if (bVar9 == 0x57) {
              bVar9 = 8;
            }
            else {
              if (bVar9 == 0x62) {
                cVar10 = '\t';
                goto LAB_0021ebb5;
              }
              if (bVar9 != 0x77) goto switchD_0021e875_caseD_3a;
              bVar9 = 7;
            }
LAB_0021ebdf:
            re_build_char(ctx,&local_468,bVar9);
            goto LAB_0021ebea;
          }
          switch(bVar9) {
          case 0x31:
          case 0x32:
          case 0x33:
          case 0x34:
          case 0x35:
          case 0x36:
          case 0x37:
          case 0x38:
          case 0x39:
            rVar5 = re_alloc_state(ctx);
            local_468.init = rVar5;
            rVar6 = re_alloc_state(ctx);
            local_468.final = rVar6;
            prVar1 = ctx->tuple_arr + rVar5;
            if (ctx->tuple_arr[rVar5].next_state_1 == -1) {
              if ((prVar1->flags & 6) == 0) {
                prVar1->ch = bVar9 - 0x24;
              }
              prVar1->next_state_1 = rVar6;
            }
            else {
              prVar1->next_state_2 = rVar6;
            }
            goto LAB_0021ebea;
          default:
switchD_0021e875_caseD_3a:
            goto LAB_0021ebdf;
          case 0x3c:
            cVar10 = '\x05';
            break;
          case 0x3e:
            cVar10 = '\x06';
            break;
          case 0x42:
            cVar10 = '\n';
          }
LAB_0021ebb5:
          re_build_char(ctx,&local_468,cVar10);
          re_concat_onto(ctx,&local_460,&local_468);
          exprlen = uVar17;
        }
        break;
      default:
switchD_0021e71a_caseD_26:
        goto LAB_0021e8bd;
      case 0x28:
        if (0x32 < uVar16) {
          return RE_STATUS_GROUP_NESTING_TOO_DEEP;
        }
        *(re_machine *)((long)arStack_418 + uVar16 * 0x14) = local_460;
        *(re_machine *)((long)arStack_418 + uVar16 * 0x14 + 8) = local_458;
        iVar4 = ctx->cur_group;
        aiStack_408[uVar16 * 5] = iVar4;
        ctx->cur_group = iVar4 + 1;
        uVar16 = uVar16 + 1;
        local_460.init = -1;
        local_460.final = -1;
        local_458.init = -1;
        local_458.final = -1;
        break;
      case 0x29:
        if (uVar16 != 0) {
          uVar16 = uVar16 - 1;
          re_alternate_onto(ctx,&local_458,&local_460);
          local_450 = CONCAT44(local_450._4_4_,aiStack_408[uVar16 * 5]);
          rVar5 = re_alloc_state(ctx);
          local_468.init = rVar5;
          rVar6 = re_alloc_state(ctx);
          local_468.final = rVar6;
          prVar1 = ctx->tuple_arr + rVar5;
          if (ctx->tuple_arr[rVar5].next_state_1 == -1) {
            if ((prVar1->flags & 6) == 0) {
              prVar1->ch = '\x01';
            }
            prVar1->next_state_1 = local_458.init;
          }
          else {
            prVar1->next_state_2 = local_458.init;
          }
          prVar1 = ctx->tuple_arr + local_458.final;
          if (ctx->tuple_arr[local_458.final].next_state_1 == -1) {
            if ((prVar1->flags & 6) == 0) {
              prVar1->ch = '\x01';
            }
            prVar1->next_state_1 = rVar6;
          }
          else {
            prVar1->next_state_2 = rVar6;
          }
          puVar2 = &ctx->tuple_arr[rVar5].flags;
          *puVar2 = *puVar2 | 2;
          puVar2 = &ctx->tuple_arr[rVar6].flags;
          *puVar2 = *puVar2 | 4;
          ctx->tuple_arr[rVar5].ch = (char)local_450;
          ctx->tuple_arr[rVar6].ch = (char)local_450;
          local_460 = *(re_machine *)((long)arStack_418 + uVar16 * 0x14);
          local_458 = *(re_machine *)((long)arStack_418 + uVar16 * 0x14 + 8);
          goto LAB_0021ebea;
        }
        uVar16 = 0;
        break;
      case 0x2e:
        bVar9 = 2;
LAB_0021e8bd:
        re_build_char(ctx,&local_468,bVar9);
LAB_0021ebea:
        pbVar15 = (byte *)expr;
        exprlen = uVar17;
        if (1 < uVar17) {
          bVar9 = ((byte *)expr)[1];
          if (((ulong)bVar9 < 0x40) && ((0x80000c0000000000U >> ((ulong)bVar9 & 0x3f) & 1) != 0)) {
            local_450 = uVar16;
            rVar5 = re_alloc_state(ctx);
            rVar6 = re_alloc_state(ctx);
            prVar1 = ctx->tuple_arr + rVar5;
            if (ctx->tuple_arr[rVar5].next_state_1 == -1) {
              if ((prVar1->flags & 6) == 0) {
                prVar1->ch = '\x01';
              }
              prVar1->next_state_1 = local_468.init;
            }
            else {
              prVar1->next_state_2 = local_468.init;
            }
            lVar12 = (long)local_468.final;
            prVar1 = ctx->tuple_arr + lVar12;
            if (ctx->tuple_arr[lVar12].next_state_1 == -1) {
              if ((prVar1->flags & 6) == 0) {
                prVar1->ch = '\x01';
              }
              prVar1->next_state_1 = rVar6;
            }
            else {
              prVar1->next_state_2 = rVar6;
            }
            if (bVar9 == 0x3f) {
LAB_0021ecaf:
              prVar1 = ctx->tuple_arr + rVar5;
              if (ctx->tuple_arr[rVar5].next_state_1 == -1) {
                if ((prVar1->flags & 6) == 0) {
                  prVar1->ch = '\x01';
                }
                prVar1->next_state_1 = rVar6;
              }
              else {
                prVar1->next_state_2 = rVar6;
              }
            }
            else {
              prVar1 = ctx->tuple_arr + lVar12;
              if (ctx->tuple_arr[lVar12].next_state_1 == -1) {
                if ((prVar1->flags & 6) == 0) {
                  prVar1->ch = '\x01';
                }
                prVar1->next_state_1 = local_468.init;
              }
              else {
                prVar1->next_state_2 = local_468.init;
              }
              if (bVar9 != 0x2b) goto LAB_0021ecaf;
            }
            pbVar15 = (byte *)expr + 1;
            local_468.final = rVar6;
            local_468.init = rVar5;
            exprlen = uVar17 - 1;
            uVar16 = local_450;
            if (1 < exprlen) {
              do {
                if ((0x3f < (ulong)pbVar15[1]) ||
                   ((0x80000c0000000000U >> ((ulong)pbVar15[1] & 0x3f) & 1) == 0))
                goto LAB_0021ed2f;
                pbVar15 = pbVar15 + 1;
                exprlen = exprlen - 1;
              } while (1 < exprlen);
              pbVar15 = (byte *)expr + (uVar17 - 1);
              exprlen = 1;
            }
          }
        }
LAB_0021ed2f:
        expr = (char *)pbVar15;
        re_concat_onto(ctx,&local_460,&local_468);
      }
LAB_0021ed45:
      expr = (char *)((byte *)expr + 1);
      exprlen = exprlen - 1;
    } while (exprlen != 0);
  }
  re_alternate_onto(ctx,&local_458,&local_460);
  *local_420 = local_458;
  return RE_STATUS_SUCCESS;
}

Assistant:

static re_status_t re_compile(re_context *ctx,
                              const char *expr, size_t exprlen,
                              re_machine *result_machine)
{
    re_machine cur_machine;
    re_machine alter_machine;
    re_machine new_machine;
    size_t group_stack_level;
    struct
    {
        re_machine old_cur;
        re_machine old_alter;
        int group_id;
    } group_stack[50];

    /* reset everything */
    re_reset(ctx);

    /* start out with no current machine and no alternate machine */
    re_build_null_machine(ctx, &cur_machine);
    re_build_null_machine(ctx, &alter_machine);

    /* nothing on the stack yet */
    group_stack_level = 0;

    /* loop until we run out of expression to parse */
    for ( ; exprlen != 0 ; ++expr, --exprlen)
    {
        switch(*expr)
        {
        case '^':
            /*
             *   beginning of line - if we're not at the beginning of the
             *   current expression (i.e., we already have some
             *   concatentations accumulated), treat it as an ordinary
             *   character 
             */
            if (!re_is_machine_null(ctx, &cur_machine))
                goto normal_char;

            /* build a new start-of-text recognizer */
            re_build_char(ctx, &new_machine, RE_TEXT_BEGIN);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;

        case '$':
            /*
             *   End of line specifier - if there's anything left after
             *   the '$' other than a close parens or alternation
             *   specifier, great it as a normal character 
             */
            if (exprlen > 1
                && (*(expr+1) != ')' && *(expr+1) != '|'))
                goto normal_char;

            /* build a new end-of-text recognizer */
            re_build_char(ctx, &new_machine, RE_TEXT_END);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;
            
        case '(':
            /* 
             *   Add a nesting level.  Push the current machine and
             *   alternate machines onto the group stack, and clear
             *   everything out for the new group. 
             */
            if (group_stack_level
                > sizeof(group_stack)/sizeof(group_stack[0]))
            {
                /* we cannot proceed - return an error */
                return RE_STATUS_GROUP_NESTING_TOO_DEEP;
            }

            /* save the current state on the stack */
            group_stack[group_stack_level].old_cur = cur_machine;
            group_stack[group_stack_level].old_alter = alter_machine;

            /* 
             *   Assign the group a group ID - groups are numbered in
             *   order of their opening (left) parentheses, so we want to
             *   assign a group number now.  We won't actually need to
             *   know the group number until we get to the matching close
             *   paren, but we need to assign it now, so store it in the
             *   group stack. 
             */
            group_stack[group_stack_level].group_id = ctx->cur_group;

            /* consume the group number */
            ctx->cur_group++;

            /* push the level */
            ++group_stack_level;

            /* start the new group with empty machines */
            re_build_null_machine(ctx, &cur_machine);
            re_build_null_machine(ctx, &alter_machine);
            break;

        case ')':
            /* if there's nothing on the stack, ignore this */
            if (group_stack_level == 0)
                break;

            /* take a level off the stack */
            --group_stack_level;

            /* 
             *   Remove a nesting level.  If we have a pending alternate
             *   expression, build the alternation expression.  This will
             *   leave the entire group expression in alter_machine,
             *   regardless of whether an alternation was in progress or
             *   not.  
             */
            re_alternate_onto(ctx, &alter_machine, &cur_machine);

            /*
             *   Create a group machine that encloses the group and marks
             *   it with a group number.  We assigned the group number
             *   when we parsed the open paren, so read that group number
             *   from the stack.
             *   
             *   Note that this will leave 'new_machine' with the entire
             *   group machine.  
             */
            re_build_group(ctx, &new_machine, &alter_machine,
                           group_stack[group_stack_level].group_id);

            /*
             *   Pop the stack - restore the alternation and current
             *   machines that were in progress before the group started. 
             */
            cur_machine = group_stack[group_stack_level].old_cur;
            alter_machine = group_stack[group_stack_level].old_alter;

            /*
             *   Check the group expression (in new_machine) for postfix
             *   expressions 
             */
            goto apply_postfix;

        case '|':
            /* 
             *   Start a new alternation.  This ends the current
             *   alternation; if we have a previous pending alternate,
             *   build an alternation machine out of the previous
             *   alternate and the current machine and move that to the
             *   alternate; otherwise, simply move the current machine to
             *   the pending alternate. 
             */
            re_alternate_onto(ctx, &alter_machine, &cur_machine);

            /* 
             *   the alternation starts out with a blank slate, so null
             *   out the current machine 
             */
            re_build_null_machine(ctx, &cur_machine);
            break;

        case '%':
            /* 
             *   quoted character - skip the quote mark and see what we
             *   have 
             */
            ++expr;
            --exprlen;

            /* check to see if we're at the end of the expression */
            if (exprlen == 0)
            {
                /* 
                 *   end of the string - ignore it, but undo the extra
                 *   increment of the expression index so that we exit the
                 *   enclosing loop properly 
                 */
                --expr;
                ++exprlen;
                break;
            }

            /* see what we have */
            switch(*expr)
            {
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                /* group match - build a new literal group recognizer */
                re_build_group_matcher(ctx, &new_machine, (int)(*expr - '1'));

                /* apply any postfix expression to the group recognizer */
                goto apply_postfix;

            case '<':
                /* build a beginning-of-word recognizer */
                re_build_char(ctx, &new_machine, RE_WORD_BEGIN);

                /* it can't be postfixed - just concatenate it */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case '>':
                /* build an end-of-word recognizer */
                re_build_char(ctx, &new_machine, RE_WORD_END);

                /* it can't be postfixed - just concatenate it */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case 'w':
                /* word character */
                re_build_char(ctx, &new_machine, RE_WORD_CHAR);
                goto apply_postfix;

            case 'W':
                /* non-word character */
                re_build_char(ctx, &new_machine, RE_NON_WORD_CHAR);
                goto apply_postfix;

            case 'b':
                /* word boundary */
                re_build_char(ctx, &new_machine, RE_WORD_BOUNDARY);

                /* it can't be postfixed */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case 'B':
                /* not a word boundary */
                re_build_char(ctx, &new_machine, RE_NON_WORD_BOUNDARY);

                /* it can't be postfixed */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            default:
                /* build a new literal character recognizer */
                re_build_char(ctx, &new_machine, *expr);

                /* apply any postfix expression to the character */
                goto apply_postfix;
            }
            break;

        case '.':
            /* 
             *   wildcard character - build a single character recognizer
             *   for the special wildcard symbol, then go check it for a
             *   postfix operator 
             */
            re_build_char(ctx, &new_machine, RE_WILDCARD);
            goto apply_postfix;
            break;

        case '[':
            /* range expression */
            {
                int is_exclusive = FALSE;
                unsigned char set[32];

                /* clear out the set of characters in the range */
                memset(set, 0, sizeof(set));

                /* first, skip the open bracket */
                ++expr;
                --exprlen;

                /* check to see if starts with the exclusion character */
                if (exprlen != 0 && *expr == '^')
                {
                    /* skip the exclusion specifier */
                    ++expr;
                    --exprlen;

                    /* note it */
                    is_exclusive = TRUE;
                }

                /* 
                 *   if the first character is a ']', include it in the
                 *   range 
                 */
                if (exprlen != 0 && *expr == ']')
                {
                    re_set_bit(set, (int)']');
                    ++expr;
                    --exprlen;
                }

                /*
                 *   if the next character is a '-', include it in the
                 *   range 
                 */
                if (exprlen != 0 && *expr == '-')
                {
                    re_set_bit(set, (int)'-');
                    ++expr;
                    --exprlen;
                }

                /* scan the character set */
                while (exprlen != 0 && *expr != ']')
                {
                    int ch;
                    
                    /* note this character */
                    ch = (int)(unsigned char)*expr;

                    /* set it */
                    re_set_bit(set, ch);

                    /* skip this character of the expression */
                    ++expr;
                    --exprlen;

                    /* check for a range */
                    if (exprlen != 0 && *expr == '-')
                    {
                        int ch2;
                        
                        /* skip the '-' */
                        ++expr;
                        --exprlen;
                        if (exprlen != 0)
                        {
                            /* get the other end of the range */
                            ch2 = (int)(unsigned char)*expr;

                            /* skip the second character */
                            ++expr;
                            --exprlen;

                            /* if the range is reversed, swap it */
                            if (ch > ch2)
                            {
                                int tmp = ch;
                                ch = ch2;
                                ch2 = tmp;
                            }

                            /* fill in the range */
                            for ( ; ch <= ch2 ; ++ch)
                                re_set_bit(set, ch);
                        }
                    }
                }

                /* create a character range machine */
                re_build_char_range(ctx, &new_machine, set, is_exclusive);

                /* apply any postfix operator */
                goto apply_postfix;
            }            
            break;

        default:
        normal_char:
            /* 
             *   it's an ordinary character - build a single character
             *   recognizer machine, and then concatenate it onto any
             *   existing machine 
             */
            re_build_char(ctx, &new_machine, *expr);

        apply_postfix:
            /*
             *   Check for a postfix operator, and apply it to the machine
             *   in 'new_machine' if present.  In any case, concatenate
             *   the 'new_machine' (modified by a postix operator or not)
             *   to the current machien.  
             */
            if (exprlen > 1)
            {
                switch(*(expr+1))
                {
                case '*':
                case '+':
                case '?':
                    /*
                     *   We have a postfix closure operator.  Build a new
                     *   closure machine out of 'new_machine'.  
                     */
                    {
                        re_machine closure_machine;
                        
                        /* move onto the closure operator */
                        ++expr;
                        --exprlen;
                        
                        /* build the closure machine */
                        re_build_closure(ctx, &closure_machine,
                                         &new_machine, *expr);
                        
                        /* replace the original machine with the closure */
                        new_machine = closure_machine;
                        
                        /* 
                         *   skip any redundant closure symbols, keeping
                         *   only the first one we saw 
                         */
                        while (exprlen > 1 && (*(expr+1) == '?'
                                               || *(expr+1) == '+'
                                               || *(expr+1) == '*'))
                        {
                            ++expr;
                            --exprlen;
                        }
                    }
                    break;
                    
                default:
                    /* no postfix operator */
                    break;
                }
            }

            /*
             *   Concatenate the new machine onto the current machine
             *   under construction.  
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;
        }
    }

    /* complete any pending alternation */
    re_alternate_onto(ctx, &alter_machine, &cur_machine);

    /* store the resulting machine in the caller's machine descriptor */
    *result_machine = alter_machine;

    /* no errors encountered */
    return RE_STATUS_SUCCESS;
}